

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_addEquivalenceSecondParameterNullptr_Test::TestBody
          (Variable_addEquivalenceSecondParameterNullptr_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertionResult local_148 [2];
  AssertHelper local_128 [8];
  Message local_120 [8];
  shared_ptr<libcellml::Variable> local_118;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  VariablePtr v1;
  ComponentPtr comp1;
  ModelPtr m;
  Variable_addEquivalenceSecondParameterNullptr_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"modelName",&local_61);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"component1",&local_99);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"variable1",&local_c1);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"dimensionless",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_118,(nullptr_t)0x0);
  bVar1 = libcellml::Variable::addEquivalence((shared_ptr *)local_40,(shared_ptr *)&local_118);
  local_101 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_118);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_148,local_100,"libcellml::Variable::addEquivalence(v1, nullptr)","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x551,pcVar6);
    testing::internal::AssertHelper::operator=(local_128,local_120);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    std::__cxx11::string::~string((string *)local_148);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_40);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Variable, addEquivalenceSecondParameterNullptr)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);

    m->addComponent(comp1);

    EXPECT_FALSE(libcellml::Variable::addEquivalence(v1, nullptr));
}